

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

void helper_sve_sqaddi_d_aarch64(void *d,void *a,int64_t b,uint32_t desc)

{
  ulong uVar1;
  intptr_t iVar2;
  ulong uVar3;
  ulong local_48;
  int64_t r;
  int64_t ai;
  intptr_t oprsz;
  intptr_t i;
  uint32_t desc_local;
  int64_t b_local;
  void *a_local;
  void *d_local;
  
  iVar2 = simd_oprsz(desc);
  for (oprsz = 0; oprsz < iVar2; oprsz = oprsz + 8) {
    uVar1 = *(ulong *)((long)a + oprsz);
    uVar3 = uVar1 + b;
    local_48 = uVar3;
    if (((long)((uVar3 ^ uVar1) & (uVar1 ^ b ^ 0xffffffffffffffff)) < 0) &&
       (local_48 = 0x8000000000000000, (long)uVar3 < 0)) {
      local_48 = 0x7fffffffffffffff;
    }
    *(ulong *)((long)d + oprsz) = local_48;
  }
  return;
}

Assistant:

void HELPER(sve_sqaddi_d)(void *d, void *a, int64_t b, uint32_t desc)
{
    intptr_t i, oprsz = simd_oprsz(desc);

    for (i = 0; i < oprsz; i += sizeof(int64_t)) {
        int64_t ai = *(int64_t *)((char *)a + i);
        int64_t r = ai + b;
        if (((r ^ ai) & ~(ai ^ b)) < 0) {
            /* Signed overflow.  */
            r = (r < 0 ? INT64_MAX : INT64_MIN);
        }
        *(int64_t *)((char *)d + i) = r;
    }
}